

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_ConstructorDefaultFactor_Test<pica::Particle<(pica::Dimension)1>_>::TestBody
          (ParticleTest_ConstructorDefaultFactor_Test<pica::Particle<(pica::Dimension)1>_> *this)

{
  bool bVar1;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  int d_1;
  AssertionResult gtest_ar;
  int d;
  ParticleType particle;
  ChargeType charge;
  MassType mass;
  MomentumType momentum;
  PositionType position;
  AssertHelper *in_stack_fffffffffffffe60;
  double *in_stack_fffffffffffffe68;
  MomentumType *in_stack_fffffffffffffe70;
  PositionType *in_stack_fffffffffffffe78;
  int line;
  Particle<(pica::Dimension)1> *in_stack_fffffffffffffe80;
  double *in_stack_fffffffffffffe88;
  Type type;
  Particle<(pica::Dimension)1> *in_stack_fffffffffffffe90;
  BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *in_stack_fffffffffffffe98;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb8;
  AssertHelper *in_stack_fffffffffffffec0;
  AssertionResult local_128 [2];
  MassType local_108;
  AssertionResult local_100 [2];
  Vector3<double> local_e0;
  AssertionResult local_c8;
  int local_b8;
  uint local_b4;
  Vector1<double> local_90;
  AssertionResult local_88;
  int local_74;
  Particle<(pica::Dimension)1> local_70;
  double local_38;
  double local_30;
  Vector3<double> local_28;
  Vector1<double> local_10 [2];
  
  local_10[0].x =
       (double)BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::getPosition
                         (in_stack_fffffffffffffe98,(Real)in_stack_fffffffffffffe90,
                          (Real)in_stack_fffffffffffffe88,(Real)in_stack_fffffffffffffe80);
  pica::Vector3<double>::Vector3(&local_28,3254.23,-123.324,123000.0);
  local_30 = pica::Constants<double>::electronMass();
  local_38 = pica::Constants<double>::electronCharge();
  pica::Particle<(pica::Dimension)1>::Particle
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             (FactorType)in_stack_fffffffffffffe68,
             (TypeIndexType)((ulong)in_stack_fffffffffffffe60 >> 0x30));
  local_74 = 0;
  while( true ) {
    if (0 < local_74) {
      local_b8 = 0;
      while( true ) {
        type = (Type)((ulong)in_stack_fffffffffffffe88 >> 0x20);
        if (2 < local_b8) {
          local_108 = pica::Particle<(pica::Dimension)1>::getMass(&local_70);
          testing::internal::EqHelper<false>::Compare<double,double>
                    ((char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
                     in_stack_fffffffffffffe68,(double *)in_stack_fffffffffffffe60);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_100);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe90);
            in_stack_fffffffffffffe68 =
                 (double *)testing::AssertionResult::failure_message((AssertionResult *)0x1fa279);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffe90,type,
                       (char *)in_stack_fffffffffffffe80,
                       (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                       (char *)in_stack_fffffffffffffe70);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffec0,(Message *)in_stack_fffffffffffffeb8.ptr_);
            testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
            testing::Message::~Message((Message *)0x1fa2d6);
          }
          local_b4 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fa35a);
          if (local_b4 == 0) {
            pica::Particle<(pica::Dimension)1>::getCharge(&local_70);
            testing::internal::EqHelper<false>::Compare<double,double>
                      ((char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
                       in_stack_fffffffffffffe68,(double *)in_stack_fffffffffffffe60);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_128);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffe90);
              in_stack_fffffffffffffe60 =
                   (AssertHelper *)
                   testing::AssertionResult::failure_message((AssertionResult *)0x1fa3ea);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffe90,type,
                         (char *)in_stack_fffffffffffffe80,
                         (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                         (char *)in_stack_fffffffffffffe70);
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffffec0,(Message *)in_stack_fffffffffffffeb8.ptr_);
              testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
              testing::Message::~Message((Message *)0x1fa438);
            }
            local_b4 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fa4b9);
            if (local_b4 == 0) {
              pica::Particle<(pica::Dimension)1>::getFactor(&local_70);
              testing::internal::EqHelper<false>::Compare<double,double>
                        ((char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
                         in_stack_fffffffffffffe68,(double *)in_stack_fffffffffffffe60);
              line = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                ((AssertionResult *)&stack0xfffffffffffffeb0);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffffe90);
                testing::AssertionResult::failure_message((AssertionResult *)0x1fa54b);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)in_stack_fffffffffffffe90,type,
                           (char *)in_stack_fffffffffffffe80,line,(char *)in_stack_fffffffffffffe70)
                ;
                testing::internal::AssertHelper::operator=
                          (in_stack_fffffffffffffec0,(Message *)in_stack_fffffffffffffeb8.ptr_);
                testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
                testing::Message::~Message((Message *)0x1fa597);
              }
              local_b4 = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fa60f);
            }
          }
          return;
        }
        in_stack_fffffffffffffe78 =
             (PositionType *)pica::Vector3<double>::operator[](&local_28,local_b8);
        pica::Particle<(pica::Dimension)1>::getMomentum(in_stack_fffffffffffffe90);
        pica::Vector3<double>::operator[](&local_e0,local_b8);
        testing::internal::EqHelper<false>::Compare<double,double>
                  ((char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
                   in_stack_fffffffffffffe68,(double *)in_stack_fffffffffffffe60);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe90);
          in_stack_fffffffffffffe70 =
               (MomentumType *)
               testing::AssertionResult::failure_message((AssertionResult *)0x1fa0e7);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe90,
                     (Type)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                     (char *)in_stack_fffffffffffffe80,
                     (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                     (char *)in_stack_fffffffffffffe70);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffec0,(Message *)in_stack_fffffffffffffeb8.ptr_);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
          testing::Message::~Message((Message *)0x1fa144);
        }
        local_b4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fa1c8);
        if (local_b4 != 0) break;
        local_b8 = local_b8 + 1;
      }
      return;
    }
    in_stack_fffffffffffffe88 = pica::Vector1<double>::operator[](local_10,local_74);
    local_90.x = (double)pica::Particle<(pica::Dimension)1>::getPosition(&local_70);
    pica::Vector1<double>::operator[](&local_90,local_74);
    testing::internal::EqHelper<false>::Compare<double,double>
              ((char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe68,(double *)in_stack_fffffffffffffe60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe90);
      in_stack_fffffffffffffe80 =
           (Particle<(pica::Dimension)1> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x1f9f18);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffe90,
                 (Type)((ulong)in_stack_fffffffffffffe88 >> 0x20),(char *)in_stack_fffffffffffffe80,
                 (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),(char *)in_stack_fffffffffffffe70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffec0,(Message *)in_stack_fffffffffffffeb8.ptr_);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
      testing::Message::~Message((Message *)0x1f9f75);
    }
    local_b4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f9ff9);
    if (local_b4 != 0) break;
    local_74 = local_74 + 1;
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, ConstructorDefaultFactor)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    PositionType position = this->getPosition(-12.34, 0.2, 423.12e-2);
    MomentumType momentum(3254.23, -123.324, 1.23e5);
    MassType mass = Constants<MassType>::electronMass();
    ChargeType charge = Constants<ChargeType>::electronCharge();
    ParticleType particle(position, momentum);
    ASSERT_EQ_VECTOR(position, particle.getPosition(), this->dimension);
    ASSERT_EQ_VECTOR(momentum, particle.getMomentum(), this->momentumDimension);
    ASSERT_EQ(mass, particle.getMass());
    ASSERT_EQ(charge, particle.getCharge());
    ASSERT_EQ(static_cast<FactorType>(1.0), particle.getFactor());
}